

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

string * __thiscall
soul::Program::ProgramImpl::getVariableNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Variable *v)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  string *psVar2;
  pointer ppVar3;
  pool_ref<soul::heart::Variable> *ppVar4;
  size_type sVar5;
  pointer pcVar6;
  pointer ppVar7;
  string local_50;
  
  if ((v->role & ~external) == state) {
    ppVar3 = (this->modules).
             super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = (this->modules).
                  super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      ppVar4 = (ppVar7->object->stateVariables).stateVariables.items;
      ppVar1 = ppVar4 + (ppVar7->object->stateVariables).stateVariables.numActive;
      ppVar4 = std::
               __find_if<soul::pool_ref<soul::heart::Variable>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Variable_const>>
                         (ppVar4,ppVar1,v);
      if (ppVar4 != ppVar1) {
        psVar2 = (v->name).name;
        if (ppVar7->object != context) {
          if (psVar2 != (string *)0x0) {
            TokenisedPathString::join(&local_50,&ppVar7->object->fullName,psVar2);
            stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          goto LAB_001e0b8a;
        }
        if (psVar2 == (string *)0x0) {
          throwInternalCompilerError("isValid()","toString",0x23);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = (psVar2->_M_dataplus)._M_p;
        sVar5 = psVar2->_M_string_length;
        goto LAB_001e0ac2;
      }
    }
  }
  psVar2 = (v->name).name;
  if (psVar2 == (string *)0x0) {
LAB_001e0b8a:
    throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = (psVar2->_M_dataplus)._M_p;
  sVar5 = psVar2->_M_string_length;
LAB_001e0ac2:
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableNameWithQualificationIfNeeded (const Module& context, const heart::Variable& v) const
    {
        if (v.isState())
        {
            for (auto& m : modules)
            {
                if (contains (m->stateVariables.get(), v))
                {
                    if (m == context)
                        return v.name.toString();

                    return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, v.name));
                }
            }
        }

        return v.name;
    }